

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O2

int is_sparse_supported(char *path)

{
  int iVar1;
  uint uVar2;
  __off_t _Var3;
  sparse sparse_file [3];
  sparse sparse_file_1 [3];
  undefined4 local_418 [2];
  undefined4 local_410;
  
  sparse_file[1].type = DATA;
  sparse_file[1]._4_4_ = 0;
  sparse_file[2].size = 0;
  sparse_file[0].type = HOLE;
  sparse_file[0]._4_4_ = 0;
  sparse_file[0].size = 0x400;
  sparse_file[1].size = 0x2800;
  sparse_file[2].type = END;
  sparse_file[2]._4_4_ = 0;
  create_sparse_file("can_sparse",sparse_file);
  uVar2 = 0;
  iVar1 = open("can_sparse",2);
  if (-1 < iVar1) {
    uVar2 = 0;
    _Var3 = lseek(iVar1,0,4);
    close(iVar1);
    unlink("can_sparse");
    if ((int)_Var3 < 0) {
      sparse_file_1[1].type = DATA;
      sparse_file_1[1]._4_4_ = 0;
      sparse_file_1[2].size = 0;
      sparse_file_1[0].type = HOLE;
      sparse_file_1[0]._4_4_ = 0;
      sparse_file_1[0].size = 0x400;
      sparse_file_1[1].size = 0x2800;
      sparse_file_1[2].type = END;
      sparse_file_1[2]._4_4_ = 0;
      memset(local_418,0,0x3f0);
      create_sparse_file("can_sparse",sparse_file_1);
      iVar1 = open("can_sparse",2);
      if (-1 < iVar1) {
        local_418[0] = 1;
        local_410 = 0x11;
        uVar2 = ioctl(iVar1,0xc020660b);
        close(iVar1);
        unlink("can_sparse");
        uVar2 = ~uVar2 >> 0x1f;
      }
    }
    else {
      uVar2 = 1;
    }
  }
  return uVar2;
}

Assistant:

static int
is_sparse_supported(const char *path)
{
	const struct sparse sparse_file[] = {
 		/* This hole size is too small to create a sparse
		 * files for almost filesystem. */
		{ HOLE,	 1024 }, { DATA, 10240 },
		{ END,	0 }
	};
	int fd, r;
	const char *testfile = "can_sparse";

	(void)path; /* UNUSED */
	create_sparse_file(testfile, sparse_file);
	fd = open(testfile,  O_RDWR);
	if (fd < 0)
		return (0);
	r = lseek(fd, 0, SEEK_HOLE);
	close(fd);
	unlink(testfile);
#if defined(HAVE_LINUX_FIEMAP_H)
	if (r < 0)
		return (is_sparse_supported_fiemap(path));
	return (1);
#else
	return (r >= 0);
#endif
}